

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O0

void __thiscall
cmComputeLinkInformation::AddTargetItem
          (cmComputeLinkInformation *this,string *item,cmGeneratorTarget *target)

{
  bool bVar1;
  TargetType TVar2;
  ulong uVar3;
  pair<std::_Rb_tree_const_iterator<const_cmGeneratorTarget_*>,_bool> pVar4;
  bool local_e9;
  Item local_d8;
  _Self local_a8;
  byte local_99;
  string local_98;
  _Self local_78 [3];
  Item local_60;
  _Base_ptr local_30;
  undefined1 local_28;
  cmGeneratorTarget *local_20;
  cmGeneratorTarget *target_local;
  string *item_local;
  cmComputeLinkInformation *this_local;
  
  local_20 = target;
  target_local = (cmGeneratorTarget *)item;
  item_local = (string *)this;
  TVar2 = cmGeneratorTarget::GetType(target);
  if (TVar2 != STATIC_LIBRARY) {
    SetCurrentLinkType(this,LinkShared);
  }
  TVar2 = cmGeneratorTarget::GetType(local_20);
  if (TVar2 == SHARED_LIBRARY) {
    pVar4 = std::
            set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
            ::insert(&this->SharedLibrariesLinked,&local_20);
    local_30 = (_Base_ptr)pVar4.first._M_node;
    local_28 = pVar4.second;
  }
  if (((this->NoSONameUsesPath & 1U) == 0) ||
     (bVar1 = cmGeneratorTarget::IsImportedSharedLibWithoutSOName(local_20,&this->Config), !bVar1))
  {
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      Item::Item(&local_60,&this->LibLinkFileFlag,false,(cmGeneratorTarget *)0x0);
      std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>::
      push_back(&this->Items,&local_60);
      Item::~Item(&local_60);
    }
    local_99 = 0;
    local_e9 = false;
    if ((this->OldLinkDirMode & 1U) != 0) {
      bVar1 = cmGeneratorTarget::IsFrameworkOnApple(local_20);
      local_e9 = false;
      if (!bVar1) {
        cmsys::SystemTools::GetFilenamePath(&local_98,(string *)target_local);
        local_99 = 1;
        local_78[0]._M_node =
             (_Base_ptr)
             std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::find(&this->OldLinkDirMask,&local_98);
        local_a8._M_node =
             (_Base_ptr)
             std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end(&this->OldLinkDirMask);
        local_e9 = std::operator==(local_78,&local_a8);
      }
    }
    if ((local_99 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_98);
    }
    if (local_e9 != false) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->OldLinkDirItems,(value_type *)target_local);
    }
    Item::Item(&local_d8,(string *)target_local,true,local_20);
    std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>::
    push_back(&this->Items,&local_d8);
    Item::~Item(&local_d8);
  }
  else {
    AddSharedLibNoSOName(this,(string *)target_local);
  }
  return;
}

Assistant:

void cmComputeLinkInformation::AddTargetItem(std::string const& item,
                                             cmGeneratorTarget const* target)
{
  // This is called to handle a link item that is a full path to a target.
  // If the target is not a static library make sure the link type is
  // shared.  This is because dynamic-mode linking can handle both
  // shared and static libraries but static-mode can handle only
  // static libraries.  If a previous user item changed the link type
  // to static we need to make sure it is back to shared.
  if (target->GetType() != cmStateEnums::STATIC_LIBRARY) {
    this->SetCurrentLinkType(LinkShared);
  }

  // Keep track of shared library targets linked.
  if (target->GetType() == cmStateEnums::SHARED_LIBRARY) {
    this->SharedLibrariesLinked.insert(target);
  }

  // Handle case of an imported shared library with no soname.
  if (this->NoSONameUsesPath &&
      target->IsImportedSharedLibWithoutSOName(this->Config)) {
    this->AddSharedLibNoSOName(item);
    return;
  }

  // If this platform wants a flag before the full path, add it.
  if (!this->LibLinkFileFlag.empty()) {
    this->Items.push_back(Item(this->LibLinkFileFlag, false));
  }

  // For compatibility with CMake 2.4 include the item's directory in
  // the linker search path.
  if (this->OldLinkDirMode && !target->IsFrameworkOnApple() &&
      this->OldLinkDirMask.find(cmSystemTools::GetFilenamePath(item)) ==
        this->OldLinkDirMask.end()) {
    this->OldLinkDirItems.push_back(item);
  }

  // Now add the full path to the library.
  this->Items.push_back(Item(item, true, target));
}